

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPSourceStats::ProcessPacket
          (RTPSourceStats *this,RTPPacket *pack,RTPTime *receivetime,double tsunit,bool ownpacket,
          bool *accept,bool applyprobation,bool *onprobation)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint16_t uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  
  *onprobation = false;
  if (this->sentdata == false) {
    if (applyprobation) {
      if (this->probation == 0) {
        this->probation = 2;
        this->prevseqnr = (uint16_t)pack->extseqnr;
      }
      else {
        uVar2 = *(int *)&this->prevseqnr + 1;
        uVar4 = uVar2 & 0xffff;
        uVar1 = pack->extseqnr;
        if (uVar1 == uVar4) {
          uVar5 = (uint16_t)uVar2;
          this->prevseqnr = uVar5;
          iVar6 = this->probation + -1;
          this->probation = iVar6;
          if (iVar6 == 0) {
            *accept = true;
            this->sentdata = true;
            this->packetsreceived = this->packetsreceived + 1;
            this->numnewpackets = this->numnewpackets + 1;
            if (uVar5 == 0) {
              this->numcycles = 0x10000;
              uVar1 = 0xffff;
            }
            else {
              uVar1 = uVar4 - 1;
            }
            this->baseseqnr = uVar1;
            this->exthighseqnr = uVar1 + 1;
            dVar7 = receivetime->m_t;
            (this->prevpacktime).m_t = dVar7;
            this->prevexthighseqnr = uVar1;
            this->savedextseqnr = uVar1;
            pack->extseqnr = uVar1 + 1;
            this->prevtimestamp = pack->timestamp;
            (this->lastmsgtime).m_t = dVar7;
            if (ownpacket) {
              return;
            }
            (this->lastrtptime).m_t = dVar7;
            return;
          }
        }
        else {
          this->probation = 2;
          this->prevseqnr = (uint16_t)uVar1;
        }
      }
      *onprobation = true;
      *accept = false;
      (this->lastmsgtime).m_t = receivetime->m_t;
      return;
    }
    *accept = true;
    this->sentdata = true;
    this->packetsreceived = this->packetsreceived + 1;
    this->numnewpackets = this->numnewpackets + 1;
    if (pack->extseqnr == 0) {
      this->numcycles = 0x10000;
      uVar1 = 0xffff;
    }
    else {
      uVar1 = pack->extseqnr - 1;
    }
    this->baseseqnr = uVar1;
    this->exthighseqnr = uVar1 + 1;
    dVar7 = receivetime->m_t;
    (this->prevpacktime).m_t = dVar7;
    this->prevexthighseqnr = uVar1;
    this->savedextseqnr = uVar1;
    pack->extseqnr = uVar1 + 1;
    uVar4 = pack->timestamp;
    goto LAB_0012e0a9;
  }
  *accept = true;
  this->packetsreceived = this->packetsreceived + 1;
  this->numnewpackets = this->numnewpackets + 1;
  uVar4 = this->exthighseqnr;
  uVar2 = pack->extseqnr;
  if (uVar2 < (uVar4 & 0xffff)) {
    uVar1 = this->numcycles;
    if ((uVar2 - uVar4 & 0xffff) < (uVar4 - uVar2 & 0xffff)) {
      this->numcycles = uVar1 + 0x10000;
      uVar1 = uVar2 + uVar1 + 0x10000;
      goto LAB_0012df4c;
    }
    uVar1 = uVar1 + uVar2;
  }
  else {
    uVar1 = uVar2 + this->numcycles;
LAB_0012df4c:
    this->exthighseqnr = uVar1;
  }
  pack->extseqnr = uVar1;
  if (tsunit <= 0.0) {
    this->djitter = 0.0;
    this->jitter = 0;
    uVar4 = pack->timestamp;
  }
  else {
    uVar4 = pack->timestamp;
    uVar2 = this->prevtimestamp;
    uVar3 = uVar4 - uVar2;
    if (uVar4 < uVar2 || uVar3 == 0) {
      dVar7 = 0.0;
      if (uVar4 < uVar2) {
        uVar2 = uVar2 - uVar4;
        if (uVar2 < 0x10000000) {
          dVar7 = -(double)(int)uVar2;
        }
        else {
          dVar7 = (double)-uVar2;
        }
      }
    }
    else if (uVar3 < 0x10000000) {
      dVar7 = (double)(int)uVar3;
    }
    else {
      dVar7 = (double)((ulong)(double)-uVar3 | (ulong)DAT_00131ff0);
    }
    dVar7 = (receivetime->m_t - (this->prevpacktime).m_t) / tsunit - dVar7;
    dVar8 = -dVar7;
    if (-dVar7 <= dVar7) {
      dVar8 = dVar7;
    }
    dVar7 = (dVar8 - this->djitter) * 0.0625 + this->djitter;
    this->djitter = dVar7;
    this->jitter = (uint32_t)(long)dVar7;
  }
  dVar7 = receivetime->m_t;
  (this->prevpacktime).m_t = dVar7;
LAB_0012e0a9:
  this->prevtimestamp = uVar4;
  (this->lastmsgtime).m_t = dVar7;
  if (!ownpacket) {
    (this->lastrtptime).m_t = dVar7;
  }
  return;
}

Assistant:

void RTPSourceStats::ProcessPacket(RTPPacket *pack,const RTPTime &receivetime,double tsunit,
                                   bool ownpacket,bool *accept,bool applyprobation,bool *onprobation)
{
	JRTPLIB_UNUSED(applyprobation); // possibly unused

	// Note that the sequence number in the RTP packet is still just the
	// 16 bit number contained in the RTP header

	*onprobation = false;
	
	if (!sentdata) // no valid packets received yet
	{
#ifdef RTP_SUPPORT_PROBATION
		if (applyprobation)
		{
			bool acceptpack = false;

			if (probation)  
			{	
				uint16_t pseq;
				uint32_t pseq2;
	
				pseq = prevseqnr;
				pseq++;
				pseq2 = (uint32_t)pseq;
				if (pseq2 == pack->GetExtendedSequenceNumber()) // ok, its the next expected packet
				{
					prevseqnr = (uint16_t)pack->GetExtendedSequenceNumber();
					probation--;	
					if (probation == 0) // probation over
						acceptpack = true;
					else
						*onprobation = true;
				}
				else // not next packet
				{
					probation = RTP_PROBATIONCOUNT;
					prevseqnr = (uint16_t)pack->GetExtendedSequenceNumber();
					*onprobation = true;
				}
			}
			else // first packet received with this SSRC ID, start probation
			{
				probation = RTP_PROBATIONCOUNT;
				prevseqnr = (uint16_t)pack->GetExtendedSequenceNumber();	
				*onprobation = true;
			}
	
			if (acceptpack)
			{
				ACCEPTPACKETCODE
			}
			else
			{
				*accept = false;
				lastmsgtime = receivetime;
			}
		}
		else // No probation
		{
			ACCEPTPACKETCODE
		}
#else // No compiled-in probation support

		ACCEPTPACKETCODE

#endif // RTP_SUPPORT_PROBATION
	}
	else // already got packets
	{
		uint16_t maxseq16;
		uint32_t extseqnr;

		// Adjust max extended sequence number and set extende seq nr of packet

		*accept = true;
		packetsreceived++;
		numnewpackets++;

		maxseq16 = (uint16_t)(exthighseqnr&0x0000FFFF);
		if (pack->GetExtendedSequenceNumber() >= maxseq16)
		{
			extseqnr = numcycles+pack->GetExtendedSequenceNumber();
			exthighseqnr = extseqnr;
		}
		else
		{
			uint16_t dif1,dif2;

			dif1 = ((uint16_t)pack->GetExtendedSequenceNumber());
			dif1 -= maxseq16;
			dif2 = maxseq16;
			dif2 -= ((uint16_t)pack->GetExtendedSequenceNumber());
			if (dif1 < dif2)
			{
				numcycles += 0x00010000;
				extseqnr = numcycles+pack->GetExtendedSequenceNumber();
				exthighseqnr = extseqnr;
			}
			else
				extseqnr = numcycles+pack->GetExtendedSequenceNumber();
		}

		pack->SetExtendedSequenceNumber(extseqnr);

		// Calculate jitter

		if (tsunit > 0)
		{
#if 0
			RTPTime curtime = receivetime;
			double diffts1,diffts2,diff;

			curtime -= prevpacktime;
			diffts1 = curtime.GetDouble()/tsunit;	
			diffts2 = (double)pack->GetTimestamp() - (double)prevtimestamp;
			diff = diffts1 - diffts2;
			if (diff < 0)
				diff = -diff;
			diff -= djitter;
			diff /= 16.0;
			djitter += diff;
			jitter = (uint32_t)djitter;
#else
RTPTime curtime = receivetime;
double diffts1,diffts2,diff;
uint32_t curts = pack->GetTimestamp();

curtime -= prevpacktime;
diffts1 = curtime.GetDouble()/tsunit;	

if (curts > prevtimestamp)
{
	uint32_t unsigneddiff = curts - prevtimestamp;

	if (unsigneddiff < 0x10000000) // okay, curts realy is larger than prevtimestamp
		diffts2 = (double)unsigneddiff;
	else
	{
		// wraparound occurred and curts is actually smaller than prevtimestamp

		unsigneddiff = -unsigneddiff; // to get the actual difference (in absolute value)
		diffts2 = -((double)unsigneddiff);
	}
}
else if (curts < prevtimestamp)
{
	uint32_t unsigneddiff = prevtimestamp - curts;

	if (unsigneddiff < 0x10000000) // okay, curts really is smaller than prevtimestamp
		diffts2 = -((double)unsigneddiff); // negative since we actually need curts-prevtimestamp
	else
	{
		// wraparound occurred and curts is actually larger than prevtimestamp

		unsigneddiff = -unsigneddiff; // to get the actual difference (in absolute value)
		diffts2 = (double)unsigneddiff;
	}
}
else
	diffts2 = 0;

diff = diffts1 - diffts2;
if (diff < 0)
	diff = -diff;
diff -= djitter;
diff /= 16.0;
djitter += diff;
jitter = (uint32_t)djitter;
#endif
		}
		else
		{
			djitter = 0;
			jitter = 0;
		}

		prevpacktime = receivetime;
		prevtimestamp = pack->GetTimestamp();
		lastmsgtime = prevpacktime;
		if (!ownpacket) // for own packet, this value is set on an outgoing packet
			lastrtptime = prevpacktime;
	}
}